

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acb.h
# Opt level: O2

void Acb_ObjSetTruth(Acb_Ntk_t *p,int i,word x)

{
  uint uVar1;
  word *pwVar2;
  char *__assertion;
  
  if (i < 1) {
    __assertion = "i>0";
  }
  else {
    uVar1 = (p->vObjTruth).nSize;
    if (0 < (int)uVar1) {
      if (uVar1 <= (uint)i) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      pwVar2 = (p->vObjTruth).pArray;
      if (pwVar2[(uint)i] == 0) {
        pwVar2[(uint)i] = x;
        return;
      }
      __assert_fail("Acb_ObjTruth(p, i) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                    ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
    }
    __assertion = "Acb_NtkHasObjTruths(p)";
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
}

Assistant:

static inline void           Acb_ObjSetTruth( Acb_Ntk_t * p, int i, word x )         { assert(Acb_ObjTruth(p, i) == 0); Vec_WrdWriteEntry( &p->vObjTruth, i, x );                           }